

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::setFillColor(Text *this,Color *color)

{
  bool bVar1;
  size_t sVar2;
  Vertex *pVVar3;
  size_t sVar4;
  VertexArray *this_00;
  undefined4 *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  VertexBuffer *in_stack_00000008;
  size_t i;
  Vertex *in_stack_ffffffffffffffb8;
  VertexArray *in_stack_ffffffffffffffc0;
  ulong local_18;
  
  bVar1 = sf::operator!=((Color *)in_stack_ffffffffffffffc0,(Color *)in_stack_ffffffffffffffb8);
  if ((bVar1) && (*(undefined4 *)(in_RDI + 0xf0) = *in_RSI, (*(byte *)(in_RDI + 0x1a0) & 1) == 0)) {
    for (local_18 = 0; sVar2 = VertexArray::getVertexCount((VertexArray *)0x16b7a5),
        local_18 < sVar2; local_18 = local_18 + 1) {
      pVVar3 = VertexArray::operator[](in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
      pVVar3->color = *(Color *)(in_RDI + 0xf0);
    }
    bVar1 = VertexBuffer::isAvailable();
    if (bVar1) {
      sVar2 = VertexBuffer::getVertexCount((VertexBuffer *)(in_RDI + 0x150));
      sVar4 = VertexArray::getVertexCount((VertexArray *)0x16b81b);
      if (sVar2 != sVar4) {
        VertexArray::getVertexCount((VertexArray *)0x16b847);
        VertexBuffer::create(in_stack_00000008,unaff_retaddr);
      }
      sVar2 = VertexArray::getVertexCount((VertexArray *)0x16b865);
      if (sVar2 != 0) {
        this_00 = (VertexArray *)(in_RDI + 0x150);
        VertexArray::operator[](this_00,(size_t)in_stack_ffffffffffffffb8);
        VertexBuffer::update((VertexBuffer *)this_00,in_stack_ffffffffffffffb8);
      }
    }
  }
  return;
}

Assistant:

void Text::setFillColor(const Color& color)
{
    if (color != m_fillColor)
    {
        m_fillColor = color;

        // Change vertex colors directly, no need to update whole geometry
        // (if geometry is updated anyway, we can skip this step)
        if (!m_geometryNeedUpdate)
        {
            for (std::size_t i = 0; i < m_vertices.getVertexCount(); ++i)
                m_vertices[i].color = m_fillColor;

            if (VertexBuffer::isAvailable())
            {
                if (m_verticesBuffer.getVertexCount() != m_vertices.getVertexCount())
                    m_verticesBuffer.create(m_vertices.getVertexCount());

                if (m_vertices.getVertexCount() > 0)
                    m_verticesBuffer.update(&m_vertices[0]);
            }
        }
    }
}